

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O0

IntResult * __thiscall
slang::parsing::NumberParser::reportMissingDigits
          (NumberParser *this,Token sizeToken,Token baseToken,Token first)

{
  Token base;
  Token size;
  bool bVar1;
  Info *in_RCX;
  undefined8 in_RDX;
  IntResult *in_RDI;
  undefined8 in_R8;
  Info *in_R9;
  Token value;
  TokenKind in_stack_00000008;
  SourceLocation errLoc;
  TokenKind in_stack_000001f6;
  BumpAllocator *in_stack_000001f8;
  SourceLocation in_stack_00000200;
  NumberParser *in_stack_ffffffffffffff30;
  SourceLocation in_stack_ffffffffffffff38;
  IntResult *__return_storage_ptr__;
  string_view local_58;
  SourceLocation local_48;
  SourceLocation local_40;
  SourceLocation local_38;
  SourceLocation local_30 [2];
  Token local_20;
  undefined8 local_10;
  Info *local_8;
  
  __return_storage_ptr__ = in_RDI;
  local_20._0_8_ = in_R8;
  local_20.info = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  SourceLocation::SourceLocation(local_30);
  bVar1 = Token::operator_cast_to_bool((Token *)0x41d08a);
  if ((bVar1) && (in_stack_00000008 != EndOfFile)) {
    local_38 = Token::location((Token *)&stack0x00000008);
    local_30[0] = local_38;
  }
  else {
    local_48 = Token::location(&local_20);
    local_58 = Token::rawText(&__return_storage_ptr__->size);
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_58);
    local_40 = SourceLocation::operator+<unsigned_long>
                         ((SourceLocation *)in_stack_ffffffffffffff38,
                          (unsigned_long)in_stack_ffffffffffffff30);
    local_30[0] = local_40;
  }
  addDiag(in_stack_ffffffffffffff30,SUB84((ulong)__return_storage_ptr__ >> 0x20,0),
          in_stack_ffffffffffffff38);
  value = Token::createMissing(in_stack_000001f8,in_stack_000001f6,in_stack_00000200);
  size.info = local_8;
  size.kind = (undefined2)local_10;
  size._2_1_ = local_10._2_1_;
  size.numFlags.raw = local_10._3_1_;
  size.rawLen = local_10._4_4_;
  base.info = local_20.info;
  base.kind = local_20.kind;
  base._2_1_ = local_20._2_1_;
  base.numFlags.raw = local_20.numFlags.raw;
  base.rawLen = local_20.rawLen;
  IntResult::vector(__return_storage_ptr__,size,base,value);
  return in_RDI;
}

Assistant:

NumberParser::IntResult NumberParser::reportMissingDigits(Token sizeToken, Token baseToken,
                                                          Token first) {
    // If we issued this error in response to seeing an EOF token, back up and put
    // the error on the last consumed token instead.
    SourceLocation errLoc;
    if (first && first.kind != TokenKind::EndOfFile)
        errLoc = first.location();
    else
        errLoc = baseToken.location() + baseToken.rawText().size();

    addDiag(diag::ExpectedVectorDigits, errLoc);
    return IntResult::vector(sizeToken, baseToken,
                             Token::createMissing(alloc, TokenKind::IntegerLiteral, errLoc));
}